

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_CreateTest_ConstructFromMemory_Test::TestBody
          (ktxTexture_CreateTest_ConstructFromMemory_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffdd8) [37];
  ktxTexture1 *in_stack_fffffffffffffde0;
  ktxTexture1TestBase *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  int line;
  char *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  Type type;
  AssertHelper *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  AssertionResult *in_stack_fffffffffffffe58;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe60;
  AssertionResult local_180 [2];
  undefined4 local_15c;
  AssertionResult local_158 [2];
  undefined1 local_131;
  AssertionResult local_130 [2];
  undefined1 local_109;
  AssertionResult local_108 [2];
  undefined1 local_e2;
  undefined1 local_e1;
  AssertionResult local_e0 [2];
  undefined4 local_bc;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  undefined8 local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  undefined4 local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_10[0] = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_2c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (ktx_error_code_e *)in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->classId);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe10);
      testing::AssertionResult::failure_message((AssertionResult *)0x12e029);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                 (Message *)in_stack_fffffffffffffe58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0x12e086);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e0f4);
    local_61 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffde0,(bool *)in_stack_fffffffffffffdd8,
               (type *)0x12e122);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe10);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_78 = ktxErrorString(local_14);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffde0,(char **)in_stack_fffffffffffffdd8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe58,
                 (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                 (Message *)in_stack_fffffffffffffe58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_a0);
      testing::Message::~Message((Message *)0x12e246);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e2f0);
    if (local_a4 == 0) {
      local_bc = 1;
      testing::internal::EqHelper::Compare<class_id,_class_id,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (class_id *)in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe10 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12e37e);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12e3db);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e449);
      local_e1 = ktxTexture1TestBase::compareTexture
                           (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      local_e2 = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (bool *)in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x12e4dd);
        type = (Type)((ulong)pcVar2 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12e53a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e5a8);
      local_109 = 0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (bool *)in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe00 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12e625);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12e682);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e6f0);
      local_131 = 0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (bool *)in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffdf8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12e76d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12e7ca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e838);
      local_15c = 2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (uint *)in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffdf0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12e8b8);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12e915);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e983);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (uint *)in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffde8 =
             (ktxTexture1TestBase *)
             testing::AssertionResult::failure_message((AssertionResult *)0x12ea03);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x12ea60);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eace);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (bool *)in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0);
      line = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe58);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x12eb42);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe10,type,in_stack_fffffffffffffe00,line,
                   in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe60._M_head_impl,
                   (Message *)in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x12eb90);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ebf5);
      if (local_10[0] != 0) {
        (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture_CreateTest, ConstructFromMemory) {
    ktxTexture* texture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0, &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        EXPECT_EQ(texture->classId, ktxTexture1_c);
        EXPECT_EQ(compareTexture((ktxTexture1*)texture), true);
        EXPECT_EQ(texture->isCompressed, KTX_FALSE);
        EXPECT_EQ(texture->generateMipmaps, KTX_FALSE);
        EXPECT_EQ(texture->numDimensions, 2U);
        EXPECT_EQ(texture->numLayers, 1U);
        EXPECT_EQ(texture->isArray, KTX_FALSE);
        if (texture)
            ktxTexture_Destroy(texture);
    }
}